

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::OpenPopupEx(ImGuiID id,ImGuiPopupFlags popup_flags)

{
  int *piVar1;
  ImVec2 IVar2;
  int iVar3;
  uint uVar4;
  ImGuiWindow *pIVar5;
  ImVec2 IVar6;
  ImGuiPopupData *pIVar7;
  ulong uVar8;
  ulong uVar9;
  ImGuiContext *pIVar10;
  int iVar11;
  ImGuiPopupData *pIVar12;
  int iVar13;
  ImGuiContext *ctx;
  ImVec2 *pIVar14;
  int iVar15;
  size_t sVar16;
  ImGuiContext *g;
  undefined1 auVar17 [64];
  ImVec2 local_38;
  undefined1 extraout_var [56];
  
  pIVar10 = GImGui;
  iVar13 = (GImGui->BeginPopupStack).Size;
  if (((popup_flags & 0x20U) != 0) && (iVar13 < (GImGui->OpenPopupStack).Size)) {
    return;
  }
  pIVar5 = GImGui->NavWindow;
  iVar3 = GImGui->FrameCount;
  uVar4 = (GImGui->CurrentWindow->IDStack).Data[(long)(GImGui->CurrentWindow->IDStack).Size + -1];
  auVar17._0_8_ = NavCalcPreferredRefPos();
  auVar17._8_56_ = extraout_var;
  local_38 = (ImVec2)vmovlps_avx(auVar17._0_16_);
  uVar8 = vcmpps_avx512vl(SUB6416(ZEXT464(0xc87a0000),0),ZEXT416((uint)(pIVar10->IO).MousePos.x),2);
  uVar9 = vcmpps_avx512vl(SUB6416(ZEXT464(0xc87a0000),0),ZEXT416((uint)(pIVar10->IO).MousePos.y),2);
  pIVar14 = &(pIVar10->IO).MousePos;
  if ((uVar8 & uVar9 & 1) == 0) {
    pIVar14 = &local_38;
  }
  iVar11 = (pIVar10->OpenPopupStack).Size;
  IVar6 = *pIVar14;
  if (iVar13 < iVar11) {
    pIVar12 = (pIVar10->OpenPopupStack).Data;
    if ((pIVar12[iVar13].PopupId == id) &&
       (pIVar12[iVar13].OpenFrameCount == pIVar10->FrameCount + -1)) {
      pIVar12[iVar13].OpenFrameCount = iVar3;
      return;
    }
    ClosePopupToLevel(iVar13,false);
    iVar11 = (pIVar10->OpenPopupStack).Size;
    if (iVar11 != (pIVar10->OpenPopupStack).Capacity) {
      pIVar12 = (pIVar10->OpenPopupStack).Data;
      goto LAB_002c090b;
    }
    if (iVar11 == 0) {
      iVar13 = 8;
    }
    else {
      iVar13 = iVar11 / 2 + iVar11;
    }
    iVar15 = iVar11 + 1;
    if (iVar11 + 1 < iVar13) {
      iVar15 = iVar13;
    }
    sVar16 = (long)iVar15 * 0x30;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
  }
  else {
    if (iVar11 != (pIVar10->OpenPopupStack).Capacity) {
      pIVar12 = (pIVar10->OpenPopupStack).Data;
      goto LAB_002c090b;
    }
    if (iVar11 == 0) {
      iVar13 = 8;
    }
    else {
      iVar13 = iVar11 / 2 + iVar11;
    }
    iVar15 = iVar11 + 1;
    if (iVar11 + 1 < iVar13) {
      iVar15 = iVar13;
    }
    sVar16 = (long)iVar15 * 0x30;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
  }
  pIVar12 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(sVar16,GImAllocatorUserData);
  pIVar7 = (pIVar10->OpenPopupStack).Data;
  if (pIVar7 != (ImGuiPopupData *)0x0) {
    memcpy(pIVar12,pIVar7,(long)(pIVar10->OpenPopupStack).Size * 0x30);
    pIVar7 = (pIVar10->OpenPopupStack).Data;
    if ((pIVar7 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar7,GImAllocatorUserData);
  }
  (pIVar10->OpenPopupStack).Data = pIVar12;
  (pIVar10->OpenPopupStack).Capacity = iVar15;
  iVar11 = (pIVar10->OpenPopupStack).Size;
LAB_002c090b:
  pIVar12[iVar11].PopupId = id;
  *(undefined4 *)&pIVar12[iVar11].field_0x4 = 0;
  pIVar12[iVar11].Window = (ImGuiWindow *)0x0;
  pIVar12[iVar11].SourceWindow = pIVar5;
  pIVar12[iVar11].OpenFrameCount = iVar3;
  pIVar12[iVar11].OpenParentId = uVar4;
  IVar2 = (ImVec2)vmovlps_avx(auVar17._0_16_);
  pIVar12[iVar11].OpenPopupPos = IVar2;
  pIVar12[iVar11].OpenMousePos = IVar6;
  (pIVar10->OpenPopupStack).Size = (pIVar10->OpenPopupStack).Size + 1;
  return;
}

Assistant:

void ImGui::OpenPopupEx(ImGuiID id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;
    const int current_stack_size = g.BeginPopupStack.Size;

    if (popup_flags & ImGuiPopupFlags_NoOpenOverExistingPopup)
        if (IsPopupOpen(0u, ImGuiPopupFlags_AnyPopupId))
            return;

    ImGuiPopupData popup_ref; // Tagged as new ref as Window will be set back to NULL if we write this into OpenPopupStack.
    popup_ref.PopupId = id;
    popup_ref.Window = NULL;
    popup_ref.SourceWindow = g.NavWindow;
    popup_ref.OpenFrameCount = g.FrameCount;
    popup_ref.OpenParentId = parent_window->IDStack.back();
    popup_ref.OpenPopupPos = NavCalcPreferredRefPos();
    popup_ref.OpenMousePos = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : popup_ref.OpenPopupPos;

    IMGUI_DEBUG_LOG_POPUP("OpenPopupEx(0x%08X)\n", id);
    if (g.OpenPopupStack.Size < current_stack_size + 1)
    {
        g.OpenPopupStack.push_back(popup_ref);
    }
    else
    {
        // Gently handle the user mistakenly calling OpenPopup() every frame. It is a programming mistake! However, if we were to run the regular code path, the ui
        // would become completely unusable because the popup will always be in hidden-while-calculating-size state _while_ claiming focus. Which would be a very confusing
        // situation for the programmer. Instead, we silently allow the popup to proceed, it will keep reappearing and the programming error will be more obvious to understand.
        if (g.OpenPopupStack[current_stack_size].PopupId == id && g.OpenPopupStack[current_stack_size].OpenFrameCount == g.FrameCount - 1)
        {
            g.OpenPopupStack[current_stack_size].OpenFrameCount = popup_ref.OpenFrameCount;
        }
        else
        {
            // Close child popups if any, then flag popup for open/reopen
            ClosePopupToLevel(current_stack_size, false);
            g.OpenPopupStack.push_back(popup_ref);
        }

        // When reopening a popup we first refocus its parent, otherwise if its parent is itself a popup it would get closed by ClosePopupsOverWindow().
        // This is equivalent to what ClosePopupToLevel() does.
        //if (g.OpenPopupStack[current_stack_size].PopupId == id)
        //    FocusWindow(parent_window);
    }
}